

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_header.cpp
# Opt level: O1

bool __thiscall BamTools::HeaderTool::HeaderToolPrivate::Run(HeaderToolPrivate *this)

{
  HeaderSettings *pHVar1;
  char cVar2;
  char cVar3;
  bool bVar4;
  string *__x;
  istream *piVar5;
  ostream *poVar6;
  BamMultiReader reader;
  ifstream filelist;
  value_type local_250;
  string local_230 [16];
  
  pHVar1 = this->m_settings;
  if ((pHVar1->HasInput == false) && (pHVar1->HasInputFilelist == false)) {
    __x = Options::StandardIn_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pHVar1->InputFiles,__x);
  }
  if (this->m_settings->HasInputFilelist == true) {
    std::ifstream::ifstream(local_230,(this->m_settings->InputFilelist)._M_dataplus._M_p,_S_in);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "bamtools header ERROR: could not open input BAM file list... Aborting.",0x46);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
    }
    else {
      local_250._M_string_length = 0;
      local_250.field_2._M_local_buf[0] = '\0';
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      while( true ) {
        cVar3 = std::ios::widen((char)*(undefined8 *)(local_230[0]._M_dataplus._M_p + -0x18) +
                                (char)local_230);
        piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_230,(string *)&local_250,cVar3);
        if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->m_settings->InputFiles,&local_250);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p);
      }
    }
    std::ifstream::~ifstream(local_230);
    if (cVar2 == '\0') {
      return false;
    }
  }
  BamMultiReader::BamMultiReader((BamMultiReader *)&local_250);
  bVar4 = BamMultiReader::Open((BamMultiReader *)&local_250,&this->m_settings->InputFiles);
  if (bVar4) {
    BamMultiReader::GetHeaderText_abi_cxx11_(local_230,(BamMultiReader *)&local_250);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_230[0]._M_dataplus._M_p,
                        local_230[0]._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230[0]._M_dataplus._M_p != &local_230[0].field_2) {
      operator_delete(local_230[0]._M_dataplus._M_p);
    }
    BamMultiReader::Close((BamMultiReader *)&local_250);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "bamtools header ERROR: could not open BAM file(s) for reading... Aborting.",0x4a);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
  }
  BamMultiReader::~BamMultiReader((BamMultiReader *)&local_250);
  return bVar4;
}

Assistant:

bool HeaderTool::HeaderToolPrivate::Run()
{

    // set to default input if none provided
    if (!m_settings->HasInput && !m_settings->HasInputFilelist)
        m_settings->InputFiles.push_back(Options::StandardIn());

    // add files in the filelist to the input file list
    if (m_settings->HasInputFilelist) {

        std::ifstream filelist(m_settings->InputFilelist.c_str(), std::ios::in);
        if (!filelist.is_open()) {
            std::cerr << "bamtools header ERROR: could not open input BAM file list... Aborting."
                      << std::endl;
            return false;
        }

        std::string line;
        while (std::getline(filelist, line))
            m_settings->InputFiles.push_back(line);
    }

    // attemp to open BAM files
    BamMultiReader reader;
    if (!reader.Open(m_settings->InputFiles)) {
        std::cerr << "bamtools header ERROR: could not open BAM file(s) for reading... Aborting."
                  << std::endl;
        return false;
    }

    // dump (merged) header contents to stdout
    std::cout << reader.GetHeaderText() << std::endl;

    // clean up & exit
    reader.Close();
    return true;
}